

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

void pfx_table_for_each_ipv6_record(pfx_table *pfx_table,pfx_for_each_fp fp,void *data)

{
  long lVar1;
  long in_FS_OFFSET;
  void *data_local;
  pfx_for_each_fp fp_local;
  pfx_table *pfx_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pfx_table == (pfx_table *)0x0) {
    __assert_fail("pfx_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x22f,
                  "void pfx_table_for_each_ipv6_record(struct pfx_table *, pfx_for_each_fp, void *)"
                 );
  }
  if (pfx_table->ipv6 != (trie_node *)0x0) {
    pthread_rwlock_rdlock((pthread_rwlock_t *)&pfx_table->lock);
    pfx_table_for_each_rec(pfx_table->ipv6,fp,data);
    pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

RTRLIB_EXPORT void pfx_table_for_each_ipv6_record(struct pfx_table *pfx_table, pfx_for_each_fp fp, void *data)
{
	assert(pfx_table);

	if (!pfx_table->ipv6)
		return;

	pthread_rwlock_rdlock(&(pfx_table->lock));
	pfx_table_for_each_rec(pfx_table->ipv6, fp, data);
	pthread_rwlock_unlock(&pfx_table->lock);
}